

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O2

void __thiscall
playableWorld::playableWorld
          (playableWorld *this,pair<int,_int> agent_locationn,string *agent_directionn,World *worldd
          )

{
  this->pl = 0;
  World::World(&this->world);
  (this->agent_direction)._M_dataplus._M_p = (pointer)&(this->agent_direction).field_2;
  (this->agent_direction)._M_string_length = 0;
  (this->agent_direction).field_2._M_local_buf[0] = '\0';
  (this->agent_location).first = agent_locationn.first;
  (this->agent_location).second = agent_locationn.second;
  std::__cxx11::string::_M_assign((string *)&this->agent_direction);
  World::operator=(&this->world,worldd);
  return;
}

Assistant:

playableWorld::playableWorld(pair<int, int> agent_locationn, string agent_directionn,World worldd )
{
  agent_location = agent_locationn;
  agent_direction = agent_directionn;
  world=worldd;


}